

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::Write3dmBitmap(ON_BinaryArchive *this,ON_Bitmap *bitmap)

{
  uint *puVar1;
  ON_3dmTableStatusLink *pOVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  ON_3DM_BIG_CHUNK *pOVar6;
  
  bVar3 = ArchiveContains3dmTable(this,bitmap_table);
  bVar4 = true;
  if (bVar3) {
    bVar3 = Internal_Begin3dmTableRecord(this,bitmap_table);
    bVar4 = false;
    if ((bVar3) && (bVar4 = false, 1 < this->m_3dm_version)) {
      Internal_Increment3dmTableItemCount(this);
      lVar5 = (long)(this->m_chunk).m_count;
      pOVar6 = (this->m_chunk).m_a + lVar5;
      if ((pOVar6 == (ON_3DM_BIG_CHUNK *)0x28 || lVar5 < 1) || (pOVar6[-1].m_typecode != 0x10000016)
         ) {
        this->m_critical_error_count = this->m_critical_error_count + 1;
        pOVar2 = this->m_3dm_table_status_list;
        if ((pOVar2 != (ON_3dmTableStatusLink *)0x0) &&
           (this->m_3dm_active_table == (pOVar2->m_table_status).m_table_type)) {
          puVar1 = &(pOVar2->m_table_status).m_critical_error_count;
          *puVar1 = *puVar1 + 1;
        }
        bVar4 = false;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x2709,"",
                   "ON_BinaryArchive::Write3dmBitmap() must be called in BeginWrite3dmBitmapTable() block"
                  );
      }
      else {
        bVar4 = false;
        bVar3 = BeginWrite3dmBigChunk(this,0x20008090,0);
        if (bVar3) {
          Internal_Write3dmUpdateManifest(this,&bitmap->super_ON_ModelComponent);
          bVar3 = WriteObject(this,(ON_Object *)bitmap);
          bVar4 = EndWrite3dmChunk(this);
          bVar4 = bVar4 && bVar3;
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool ON_BinaryArchive::Write3dmBitmap( const ON_Bitmap& bitmap )
{
  if (false == ArchiveContains3dmTable(ON_3dmArchiveTableType::bitmap_table))
    return true;

  if ( false == Internal_Begin3dmTableRecord(ON_3dmArchiveTableType::bitmap_table) )
    return false;

  bool rc = false;
  if ( m_3dm_version > 1 ) 
  {
    Internal_Increment3dmTableItemCount();
    const ON_3DM_BIG_CHUNK* c = m_chunk.Last();
    if ( c && c->m_typecode == TCODE_BITMAP_TABLE ) 
    {
      rc = BeginWrite3dmChunk( TCODE_BITMAP_RECORD, 0 );
      if ( rc )
      {
        Internal_Write3dmUpdateManifest(bitmap);
        rc = WriteObject( bitmap );
        if ( !EndWrite3dmChunk() )
          rc = false;
      }
    }
    else 
    {
      Internal_ReportCriticalError();
      ON_ERROR("ON_BinaryArchive::Write3dmBitmap() must be called in BeginWrite3dmBitmapTable() block");
      rc = false;
    }
  }
  return rc;
}